

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoind.cpp
# Opt level: O2

int fork_daemon(bool nochdir,bool noclose,TokenPipeEnd *endpoint)

{
  long lVar1;
  __pid_t _Var2;
  int iVar3;
  __pid_t _Var4;
  uint __fd;
  __pid_t _Var5;
  byte bVar6;
  long in_FS_OFFSET;
  undefined1 local_40 [4];
  optional<TokenPipe> umbilical;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TokenPipe::Make();
  _Var4 = -1;
  _Var5 = _Var4;
  if (umbilical.super__Optional_base<TokenPipe,_false,_false>._M_payload.
      super__Optional_payload<TokenPipe,_true,_false,_false>.super__Optional_payload_base<TokenPipe>
      ._M_engaged == true) {
    _Var2 = fork();
    if (-1 < _Var2) {
      if (_Var2 == 0) {
        TokenPipe::TakeWriteEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close(endpoint);
        endpoint->m_fd = (int)local_40;
        local_40 = (undefined1  [4])0xffffffff;
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        TokenPipe::TakeReadEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close((TokenPipeEnd *)local_40);
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        _Var4 = setsid();
        if ((_Var4 < 0) || ((!nochdir && (iVar3 = chdir("/"), iVar3 != 0)))) goto LAB_0014a6f4;
        if (!noclose) {
          __fd = open("/dev/null",2);
          if ((int)__fd < 0) {
LAB_0014a6f4:
            exit(1);
          }
          iVar3 = dup2(__fd,0);
          bVar6 = 1;
          if ((-1 < iVar3) && (iVar3 = dup2(__fd,1), -1 < iVar3)) {
            iVar3 = dup2(__fd,2);
            bVar6 = (byte)((uint)iVar3 >> 0x1f);
          }
          if (2 < __fd) {
            close(__fd);
          }
          if (bVar6 != 0) goto LAB_0014a6f4;
        }
        TokenPipeEnd::TokenWrite(endpoint,'\0');
        _Var5 = 0;
      }
      else {
        TokenPipe::TakeReadEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close(endpoint);
        endpoint->m_fd = (int)local_40;
        local_40 = (undefined1  [4])0xffffffff;
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        TokenPipe::TakeWriteEnd((TokenPipe *)local_40);
        TokenPipeEnd::Close((TokenPipeEnd *)local_40);
        TokenPipeEnd::~TokenPipeEnd((TokenPipeEnd *)local_40);
        iVar3 = TokenPipeEnd::TokenRead(endpoint);
        _Var5 = _Var2;
        if (iVar3 != 0) {
          TokenPipeEnd::Close(endpoint);
          _Var5 = _Var4;
        }
      }
    }
  }
  std::_Optional_payload_base<TokenPipe>::_M_reset((_Optional_payload_base<TokenPipe> *)&umbilical);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return _Var5;
}

Assistant:

int fork_daemon(bool nochdir, bool noclose, TokenPipeEnd& endpoint)
{
    // communication pipe with child process
    std::optional<TokenPipe> umbilical = TokenPipe::Make();
    if (!umbilical) {
        return -1; // pipe or pipe2 failed.
    }

    int pid = fork();
    if (pid < 0) {
        return -1; // fork failed.
    }
    if (pid != 0) {
        // Parent process gets read end, closes write end.
        endpoint = umbilical->TakeReadEnd();
        umbilical->TakeWriteEnd().Close();

        int status = endpoint.TokenRead();
        if (status != 0) { // Something went wrong while setting up child process.
            endpoint.Close();
            return -1;
        }

        return pid;
    }
    // Child process gets write end, closes read end.
    endpoint = umbilical->TakeWriteEnd();
    umbilical->TakeReadEnd().Close();

#if HAVE_DECL_SETSID
    if (setsid() < 0) {
        exit(1); // setsid failed.
    }
#endif

    if (!nochdir) {
        if (chdir("/") != 0) {
            exit(1); // chdir failed.
        }
    }
    if (!noclose) {
        // Open /dev/null, and clone it into STDIN, STDOUT and STDERR to detach
        // from terminal.
        int fd = open("/dev/null", O_RDWR);
        if (fd >= 0) {
            bool err = dup2(fd, STDIN_FILENO) < 0 || dup2(fd, STDOUT_FILENO) < 0 || dup2(fd, STDERR_FILENO) < 0;
            // Don't close if fd<=2 to try to handle the case where the program was invoked without any file descriptors open.
            if (fd > 2) close(fd);
            if (err) {
                exit(1); // dup2 failed.
            }
        } else {
            exit(1); // open /dev/null failed.
        }
    }
    endpoint.TokenWrite(0); // Success
    return 0;
}